

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xds.c
# Opt level: O3

int xds_decode(xds_t *xds,uint16_t cc)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  
  bVar4 = (byte)cc;
  bVar2 = (byte)(cc >> 8);
  if (xds->state == 1) {
    if ((cc & 0xff00) == 0x8f00) {
      xds->checksum = bVar4 & 0x7f;
      xds->state = 0;
      return 2;
    }
    uVar1 = xds->size;
    uVar3 = (ulong)uVar1;
    if (0x1f < uVar3) {
      xds->state = 0;
      return 0;
    }
    xds->content[uVar3] = bVar2 & 0x7f;
    xds->content[uVar3 + 1] = bVar4 & 0x7f;
    xds->size = uVar1 + 2;
  }
  else {
    xds->class_code = '\0';
    xds->type = '\0';
    *(undefined2 *)&xds->field_0x6 = 0;
    xds->size = 0;
    xds->content[0] = '\0';
    xds->content[1] = '\0';
    xds->content[2] = '\0';
    xds->content[3] = '\0';
    xds->content[4] = '\0';
    xds->content[5] = '\0';
    xds->content[6] = '\0';
    xds->content[7] = '\0';
    xds->content[0x14] = '\0';
    xds->content[0x15] = '\0';
    xds->content[0x16] = '\0';
    xds->content[0x17] = '\0';
    xds->content[0x18] = '\0';
    xds->content[0x19] = '\0';
    xds->content[0x1a] = '\0';
    xds->content[0x1b] = '\0';
    *(undefined8 *)(xds->content + 0x1c) = 0;
    xds->content[8] = '\0';
    xds->content[9] = '\0';
    xds->content[10] = '\0';
    xds->content[0xb] = '\0';
    xds->content[0xc] = '\0';
    xds->content[0xd] = '\0';
    xds->content[0xe] = '\0';
    xds->content[0xf] = '\0';
    xds->content[0x10] = '\0';
    xds->content[0x11] = '\0';
    xds->content[0x12] = '\0';
    xds->content[0x13] = '\0';
    xds->content[0x14] = '\0';
    xds->content[0x15] = '\0';
    xds->content[0x16] = '\0';
    xds->content[0x17] = '\0';
    xds->class_code = bVar2 & 0xf;
    xds->type = bVar4 & 0xf;
    xds->state = 1;
  }
  return 1;
}

Assistant:

int xds_decode(xds_t* xds, uint16_t cc)
{
    switch (xds->state) {
    default:
    case 0:
        xds_init(xds);
        xds->class_code = (cc & 0x0F00) >> 8;
        xds->type = (cc & 0x000F);
        xds->state = 1;
        return LIBCAPTION_OK;

    case 1:
        if (0x8F00 == (cc & 0xFF00)) {
            xds->checksum = (cc & 0x007F);
            xds->state = 0;
            return LIBCAPTION_READY;
        }

        if (xds->size < 32) {
            xds->content[xds->size + 0] = (cc & 0x7F00) >> 8;
            xds->content[xds->size + 1] = (cc & 0x007F);
            xds->size += 2;
            return LIBCAPTION_OK;
        }
    }

    xds->state = 0;
    return LIBCAPTION_ERROR;
}